

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_variant.cc
# Opt level: O0

void __thiscall variant_take_copy_Test::~variant_take_copy_Test(variant_take_copy_Test *this)

{
  variant_take_copy_Test *this_local;
  
  ~variant_take_copy_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(variant, take_copy) {
    static int ctor_count;
    static int dtor_count;

    struct C {
        C() { ctor_count++; }
        C(C&&) noexcept { ctor_count++; }
        ~C() { dtor_count++; }
    };

    {
        Variant<A, B, C> v{};

        EXPECT_EQ(ctor_count, 0);
        EXPECT_EQ(dtor_count, 0);

        v.emplace<C>();
        EXPECT_EQ(ctor_count, 1);
        EXPECT_EQ(dtor_count, 0);

        auto c = v.take<C>();

        EXPECT_EQ(ctor_count, 2);
        EXPECT_EQ(dtor_count, 1);
    }

    EXPECT_EQ(ctor_count, 2);
    EXPECT_EQ(dtor_count, 2);
}